

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O0

void prepare_weights_for_2x2_convolve
               (float *layer_config_weights,int off,int cstep,__m256 *shuffle_weight,
               __m256i *weight_mask)

{
  undefined1 auVar1 [32];
  undefined1 (*in_RCX) [32];
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined1 (*in_R8) [32];
  __m256 weight_vec;
  int i;
  float weight [4];
  int local_114;
  undefined1 local_110 [16];
  undefined1 (*local_100) [32];
  undefined1 (*local_f8) [32];
  int local_f0;
  int local_ec;
  long local_e8;
  
  local_100 = in_R8;
  local_f8 = in_RCX;
  local_f0 = in_EDX;
  local_ec = in_ESI;
  local_e8 = in_RDI;
  memset(local_110,0,0x10);
  for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
    *(undefined4 *)(local_110 + (long)local_114 * 4) =
         *(undefined4 *)(local_e8 + (long)local_ec * 4);
    local_ec = local_f0 + local_ec;
  }
  auVar1 = vpermps_avx2(*local_100,ZEXT1632(local_110));
  *local_f8 = auVar1;
  auVar1 = vpermps_avx2(local_100[1],ZEXT1632(local_110));
  local_f8[1] = auVar1;
  return;
}

Assistant:

static inline void prepare_weights_for_2x2_convolve(
    const float *layer_config_weights, int off, const int cstep,
    __m256 *shuffle_weight, __m256i *weight_mask) {
  // Weights needed for 2x2 block.
  float weight[4] = { 0 };
  for (int i = 0; i < 4; ++i) {
    weight[i] = layer_config_weights[off];
    off += cstep;
  }

  const __m256 weight_vec = _mm256_castps128_ps256(_mm_loadu_ps(weight));
  shuffle_weight[0] = _mm256_permutevar8x32_ps(weight_vec, weight_mask[0]);
  shuffle_weight[1] = _mm256_permutevar8x32_ps(weight_vec, weight_mask[1]);
}